

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_lsr_16_ix(void)

{
  uint addr_in;
  uint uVar1;
  uint uVar2;
  
  addr_in = m68ki_get_ea_ix(m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8]);
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar1 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(addr_in);
  }
  uVar2 = m68k_read_memory_16(uVar1 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_16(addr_in & m68ki_cpu.address_mask,uVar2 >> 1);
  m68ki_cpu.n_flag = 0;
  m68ki_cpu.not_z_flag = uVar2 >> 1;
  m68ki_cpu.x_flag = uVar2 << 8;
  m68ki_cpu.c_flag = uVar2 << 8;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_lsr_16_ix(void)
{
	uint ea = EA_AY_IX_16();
	uint src = m68ki_read_16(ea);
	uint res = src >> 1;

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_CLEAR;
	FLAG_Z = res;
	FLAG_C = FLAG_X = src << 8;
	FLAG_V = VFLAG_CLEAR;
}